

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_crypto.cpp
# Opt level: O0

void duckdb::ParquetCrypto::AddKey(ClientContext *context,FunctionParameters *parameters)

{
  bool bVar1;
  const_reference pvVar2;
  InvalidInputException *this;
  ClientContext *unaff_retaddr;
  ConversionException *e;
  string decoded_key;
  ParquetKeys *keys;
  string *key;
  string *key_name;
  string *in_stack_ffffffffffffff08;
  string *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  allocator *paVar3;
  ParquetKeys *in_stack_ffffffffffffff20;
  allocator local_c9;
  string local_c8 [48];
  string *in_stack_ffffffffffffff68;
  string local_68 [32];
  string local_48 [32];
  ParquetKeys *local_28;
  undefined8 local_20;
  undefined8 local_18;
  
  pvVar2 = vector<duckdb::Value,_true>::operator[]
                     ((vector<duckdb::Value,_true> *)in_stack_ffffffffffffff10,
                      (size_type)in_stack_ffffffffffffff08);
  local_18 = duckdb::StringValue::Get_abi_cxx11_(pvVar2);
  pvVar2 = vector<duckdb::Value,_true>::operator[]
                     ((vector<duckdb::Value,_true> *)in_stack_ffffffffffffff10,
                      (size_type)in_stack_ffffffffffffff08);
  local_20 = duckdb::StringValue::Get_abi_cxx11_(pvVar2);
  local_28 = ParquetKeys::Get(unaff_retaddr);
  bVar1 = ValidKey(in_stack_ffffffffffffff08);
  if (bVar1) {
    ParquetKeys::AddKey(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                        in_stack_ffffffffffffff10);
  }
  else {
    std::__cxx11::string::string(local_48);
    Base64Decode(in_stack_ffffffffffffff68);
    std::__cxx11::string::operator=(local_48,local_68);
    std::__cxx11::string::~string(local_68);
    bVar1 = ValidKey(in_stack_ffffffffffffff08);
    if (!bVar1) {
      this = (InvalidInputException *)__cxa_allocate_exception(0x10);
      paVar3 = &local_c9;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_c8,
                 "Invalid AES key. Must have a length of 128, 192, or 256 bits (16, 24, or 32 bytes)"
                 ,paVar3);
      duckdb::InvalidInputException::InvalidInputException(this,local_c8);
      __cxa_throw(this,&InvalidInputException::typeinfo,
                  InvalidInputException::~InvalidInputException);
    }
    ParquetKeys::AddKey(in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,
                        in_stack_ffffffffffffff10);
    std::__cxx11::string::~string(local_48);
  }
  return;
}

Assistant:

void ParquetCrypto::AddKey(ClientContext &context, const FunctionParameters &parameters) {
	const auto &key_name = StringValue::Get(parameters.values[0]);
	const auto &key = StringValue::Get(parameters.values[1]);

	auto &keys = ParquetKeys::Get(context);
	if (ValidKey(key)) {
		keys.AddKey(key_name, key);
	} else {
		string decoded_key;
		try {
			decoded_key = Base64Decode(key);
		} catch (const ConversionException &e) {
			throw InvalidInputException("Invalid AES key. Not a plain AES key NOR a base64 encoded string");
		}
		if (!ValidKey(decoded_key)) {
			throw InvalidInputException(
			    "Invalid AES key. Must have a length of 128, 192, or 256 bits (16, 24, or 32 bytes)");
		}
		keys.AddKey(key_name, decoded_key);
	}
}